

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O1

void __thiscall Corrade::Utility::Configuration::Configuration(Configuration *this,Flags flags)

{
  ConfigurationGroup::ConfigurationGroup(&this->super_ConfigurationGroup,this);
  (this->_filename)._M_dataplus._M_p = (pointer)&(this->_filename).field_2;
  (this->_filename)._M_string_length = 0;
  (this->_filename).field_2._M_local_buf[0] = '\0';
  (this->_flags)._value = flags._value;
  return;
}

Assistant:

Configuration::Configuration(const Flags flags): ConfigurationGroup(this), _flags(static_cast<InternalFlag>(std::uint32_t(flags))) {}